

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O2

void __thiscall
QFontComboBox::setSampleTextForSystem
          (QFontComboBox *this,WritingSystem writingSystem,QString *sampleText)

{
  QString *this_00;
  long in_FS_OFFSET;
  WritingSystem local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = writingSystem;
  this_00 = QHash<QFontDatabase::WritingSystem,_QString>::operator[]
                      ((QHash<QFontDatabase::WritingSystem,_QString> *)
                       (*(long *)&(this->super_QComboBox).super_QWidget.field_0x8 + 0x368),&local_14
                      );
  QString::operator=(this_00,(QString *)sampleText);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontComboBox::setSampleTextForSystem(QFontDatabase::WritingSystem writingSystem, const QString &sampleText)
{
    Q_D(QFontComboBox);
    d->sampleTextForWritingSystem[writingSystem] = sampleText;
}